

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O3

_Bool mi_heap_check_owned(mi_heap_t *heap,void *p)

{
  mi_page_t *pmVar1;
  size_t i;
  long lVar2;
  
  if (((heap != (mi_heap_t *)0x0) && (((ulong)p & 7) == 0 && heap != &_mi_heap_empty)) &&
     (heap->page_count != 0)) {
    lVar2 = 0;
    do {
      for (pmVar1 = heap->pages[lVar2].first; pmVar1 != (mi_page_t *)0x0; pmVar1 = pmVar1->next) {
        if ((pmVar1->page_start <= p) &&
           (p < pmVar1->page_start + (ulong)pmVar1->capacity * pmVar1->block_size)) {
          return true;
        }
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x4b);
  }
  return false;
}

Assistant:

bool mi_heap_check_owned(mi_heap_t* heap, const void* p) {
  mi_assert(heap != NULL);
  if (heap==NULL || !mi_heap_is_initialized(heap)) return false;
  if (((uintptr_t)p & (MI_INTPTR_SIZE - 1)) != 0) return false;  // only aligned pointers
  bool found = false;
  mi_heap_visit_pages(heap, &mi_heap_page_check_owned, (void*)p, &found);
  return found;
}